

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>::
MatchAndExplain<pstore::small_vector<unsigned_char,128ul>>
          (ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>> *this,
          small_vector<unsigned_char,_128UL> *lhs,MatchResultListener *listener)

{
  bool bVar1;
  const_reference lhs_00;
  ostream *os_00;
  value_type *pvVar2;
  ostream *poVar3;
  char *local_c0;
  pointer_based_iterator<const_unsigned_char> local_a8;
  pointer_based_iterator<const_unsigned_char> local_a0;
  pointer_based_iterator<const_unsigned_char> local_98;
  pointer local_90;
  pointer_based_iterator<const_unsigned_char> local_88;
  pointer_based_iterator<const_unsigned_char> local_80;
  const_iterator it_1;
  const_iterator cStack_70;
  bool printed_header2;
  pointer_based_iterator<const_unsigned_char> local_68;
  pointer_based_iterator<const_unsigned_char> local_60;
  pointer local_58;
  pointer_based_iterator<const_unsigned_char> local_50;
  pointer_based_iterator<const_unsigned_char> local_48;
  const_iterator it;
  bool printed_header;
  ostream *os;
  StlContainerReference lhs_stl_container;
  MatchResultListener *listener_local;
  small_vector<unsigned_char,_128UL> *lhs_local;
  ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_> *this_local;
  
  lhs_00 = StlContainerView<pstore::small_vector<unsigned_char,_128UL>_>::ConstReference(lhs);
  bVar1 = pstore::operator==(lhs_00,(small_vector<unsigned_char,_128UL> *)this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    os_00 = MatchResultListener::stream(listener);
    if (os_00 != (ostream *)0x0) {
      it.pos_._7_1_ = 0;
      local_48.pos_ = (pointer)pstore::small_vector<unsigned_char,_128UL>::begin(lhs_00);
      while( true ) {
        local_50.pos_ = (pointer)pstore::small_vector<unsigned_char,_128UL>::end(lhs_00);
        bVar1 = pstore::pointer_based_iterator<unsigned_char_const>::operator!=
                          ((pointer_based_iterator<unsigned_char_const> *)&local_48,&local_50);
        if (!bVar1) break;
        local_60.pos_ =
             (pointer)pstore::small_vector<unsigned_char,_128UL>::begin
                                ((small_vector<unsigned_char,_128UL> *)this);
        local_68.pos_ =
             (pointer)pstore::small_vector<unsigned_char,_128UL>::end
                                ((small_vector<unsigned_char,_128UL> *)this);
        pvVar2 = pstore::pointer_based_iterator<const_unsigned_char>::operator*(&local_48);
        local_58 = (pointer)ArrayAwareFind<pstore::pointer_based_iterator<unsigned_char_const>,unsigned_char>
                                      (local_60,local_68,pvVar2);
        cStack_70 = pstore::small_vector<unsigned_char,_128UL>::end
                              ((small_vector<unsigned_char,_128UL> *)this);
        bVar1 = pstore::pointer_based_iterator<unsigned_char_const>::operator==
                          ((pointer_based_iterator<unsigned_char_const> *)&local_58,
                           &stack0xffffffffffffff90);
        if (bVar1) {
          if ((it.pos_._7_1_ & 1) == 0) {
            std::operator<<(os_00,"which has these unexpected elements: ");
            it.pos_._7_1_ = 1;
          }
          else {
            std::operator<<(os_00,", ");
          }
          pvVar2 = pstore::pointer_based_iterator<const_unsigned_char>::operator*(&local_48);
          UniversalPrint<unsigned_char>(pvVar2,os_00);
        }
        pstore::pointer_based_iterator<const_unsigned_char>::operator++(&local_48);
      }
      it_1.pos_._7_1_ = 0;
      local_80.pos_ =
           (pointer)pstore::small_vector<unsigned_char,_128UL>::begin
                              ((small_vector<unsigned_char,_128UL> *)this);
      while( true ) {
        local_88.pos_ =
             (pointer)pstore::small_vector<unsigned_char,_128UL>::end
                                ((small_vector<unsigned_char,_128UL> *)this);
        bVar1 = pstore::pointer_based_iterator<unsigned_char_const>::operator!=
                          ((pointer_based_iterator<unsigned_char_const> *)&local_80,&local_88);
        if (!bVar1) break;
        local_98.pos_ = (pointer)pstore::small_vector<unsigned_char,_128UL>::begin(lhs_00);
        local_a0.pos_ = (pointer)pstore::small_vector<unsigned_char,_128UL>::end(lhs_00);
        pvVar2 = pstore::pointer_based_iterator<const_unsigned_char>::operator*(&local_80);
        local_90 = (pointer)ArrayAwareFind<pstore::pointer_based_iterator<unsigned_char_const>,unsigned_char>
                                      (local_98,local_a0,pvVar2);
        local_a8.pos_ = (pointer)pstore::small_vector<unsigned_char,_128UL>::end(lhs_00);
        bVar1 = pstore::pointer_based_iterator<unsigned_char_const>::operator==
                          ((pointer_based_iterator<unsigned_char_const> *)&local_90,&local_a8);
        if (bVar1) {
          if ((it_1.pos_._7_1_ & 1) == 0) {
            if ((it.pos_._7_1_ & 1) == 0) {
              local_c0 = "which";
            }
            else {
              local_c0 = ",\nand";
            }
            poVar3 = std::operator<<(os_00,local_c0);
            std::operator<<(poVar3," doesn\'t have these expected elements: ");
            it_1.pos_._7_1_ = 1;
          }
          else {
            std::operator<<(os_00,", ");
          }
          pvVar2 = pstore::pointer_based_iterator<const_unsigned_char>::operator*(&local_80);
          UniversalPrint<unsigned_char>(pvVar2,os_00);
        }
        pstore::pointer_based_iterator<const_unsigned_char>::operator++(&local_80);
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }